

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O2

wchar_t motion_dir(loc start,loc finish)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  
  _Var1 = loc_eq((loc_conflict)start,(loc_conflict)finish);
  wVar2 = L'\x05';
  if (!_Var1) {
    wVar6 = start.x;
    wVar5 = finish.x;
    wVar4 = finish.y;
    wVar3 = start.y;
    if (wVar6 == wVar5) {
      wVar2 = L'\b';
      if (wVar3 < wVar4) {
        wVar2 = L'\x02';
      }
    }
    else if (wVar3 == wVar4) {
      wVar2 = (uint)(wVar6 < wVar5) * 2 + L'\x04';
    }
    else if (wVar3 < wVar4) {
      wVar2 = (uint)(wVar6 < wVar5) * 2 + L'\x01';
    }
    else if (wVar4 < wVar3) {
      wVar2 = (uint)(wVar6 < wVar5) * 2 + L'\a';
    }
  }
  return wVar2;
}

Assistant:

int motion_dir(struct loc start, struct loc finish)
{
	/* No movement required */
	if (loc_eq(start, finish)) return (DIR_NONE);

	/* South or North */
	if (start.x == finish.x) return ((start.y < finish.y) ? DIR_S : DIR_N);

	/* East or West */
	if (start.y == finish.y) return ((start.x < finish.x) ? DIR_E : DIR_W);

	/* South-east or South-west */
	if (start.y < finish.y) return ((start.x < finish.x) ? DIR_SE : DIR_SW);

	/* North-east or North-west */
	if (start.y > finish.y) return ((start.x < finish.x) ? DIR_NE : DIR_NW);

	/* Paranoia */
	return (DIR_NONE);
}